

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O2

VertexAndFaceArraysPtr __thiscall
graphics101::vao::makeSquare(vao *this,GLint position_location,GLint texcoord_location)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VertexAndFaceArraysPtr VVar1;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  TC;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  F;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  V;
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_88;
  _Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  local_68;
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_48;
  vec<3,_int,_(glm::qualifier)0> local_24;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_48,(vec<3,_float,_(glm::qualifier)0> *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf8000003f800000;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_48,(vec<3,_float,_(glm::qualifier)0> *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_48,(vec<3,_float,_(glm::qualifier)0> *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_48,(vec<3,_float,_(glm::qualifier)0> *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_88,(vec<2,_float,_(glm::qualifier)0> *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_88,(vec<2,_float,_(glm::qualifier)0> *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_88,(vec<2,_float,_(glm::qualifier)0> *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_88,(vec<2,_float,_(glm::qualifier)0> *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_24.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)0x0;
  local_24.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)0x1;
  local_24.field_2.z = 2;
  std::vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,int,(glm::qualifier)0>>
            ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
              *)&local_68,&local_24);
  local_24.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_int,_(glm::qualifier)0>_3)0x0;
  local_24.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_int,_(glm::qualifier)0>_5)0x2;
  local_24.field_2.z = 3;
  std::vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,int,(glm::qualifier)0>>
            ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
              *)&local_68,&local_24);
  std::make_shared<graphics101::VertexAndFaceArrays>();
  VertexAndFaceArrays::uploadAttribute
            (*(VertexAndFaceArrays **)this,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&local_48,position_location);
  VertexAndFaceArrays::uploadAttribute
            (*(VertexAndFaceArrays **)this,
             (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)&local_88,texcoord_location);
  VertexAndFaceArrays::uploadFaces
            (*(VertexAndFaceArrays **)this,
             (vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              *)&local_68);
  std::
  _Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_68);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_88);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_48);
  VVar1.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  VVar1.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VertexAndFaceArraysPtr)
         VVar1.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VertexAndFaceArrays::VertexAndFaceArraysPtr makeSquare( GLint position_location, GLint texcoord_location )
{
    std::vector< vec3 > V;
    V.push_back( vec3( -1, -1, 0 ) );
    V.push_back( vec3(  1, -1, 0 ) );
    V.push_back( vec3(  1,  1, 0 ) );
    V.push_back( vec3( -1,  1, 0 ) );
    
    std::vector< vec2 > TC;
    TC.push_back( vec2( 0, 0 ) );
    TC.push_back( vec2( 1, 0 ) );
    TC.push_back( vec2( 1, 1 ) );
    TC.push_back( vec2( 0, 1 ) );
    
    std::vector< ivec3 > F;
    F.push_back( ivec3( 0, 1, 2 ) );
    F.push_back( ivec3( 0, 2, 3 ) );
    
    auto vao = VertexAndFaceArrays::makePtr();
    vao->uploadAttribute( V, position_location );
    vao->uploadAttribute( TC, texcoord_location );
    vao->uploadFaces( F );
    return vao;
}